

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Attribute.h
# Opt level: O0

void __thiscall adios2::core::Attribute<unsigned_int>::~Attribute(Attribute<unsigned_int> *this)

{
  undefined8 *in_RDI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *unaff_retaddr;
  
  *in_RDI = &PTR__Attribute_0112b110;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(unaff_retaddr);
  AttributeBase::~AttributeBase((AttributeBase *)0x82dad4);
  return;
}

Assistant:

~Attribute() = default;